

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

void scalar_select(t_gobj *z,_glist *owner,int state)

{
  t_pd s;
  t_template *template;
  t_symbol *s_00;
  char *s_01;
  t_atom at;
  t_gpointer gp;
  
  s = z[1].g_pd;
  gp.gp_stub = (t_gstub *)0x0;
  gp.gp_valid = 0;
  gp.gp_un.gp_scalar = (_scalar *)0x0;
  gpointer_setglist(((t_symbol *)&gp).w_gpointer,owner,(t_scalar *)z);
  at.a_type = A_POINTER;
  at.a_w.w_symbol = ((t_symbol *)&gp).w_symbol;
  template = template_findbyname((t_symbol *)s);
  if (template != (t_template *)0x0) {
    s_01 = "select";
    if (state == 0) {
      s_01 = "deselect";
    }
    s_00 = gensym(s_01);
    template_notify(template,s_00,1,&at);
  }
  gpointer_unset(&gp);
  scalar_drawselectrect((t_scalar *)z,owner,state);
  return;
}

Assistant:

static void scalar_select(t_gobj *z, t_glist *owner, int state)
{
    t_scalar *x = (t_scalar *)z;
    t_template *tmpl;
    t_symbol *templatesym = x->sc_template;
    t_atom at;
    t_gpointer gp;
    gpointer_init(&gp);
    gpointer_setglist(&gp, owner, x);
    SETPOINTER(&at, &gp);
    if ((tmpl = template_findbyname(templatesym)))
        template_notify(tmpl, (state ? gensym("select") : gensym("deselect")),
            1, &at);
    gpointer_unset(&gp);
    scalar_drawselectrect(x, owner, state);
}